

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O2

bool __thiscall
HPack::Encoder::encodeRequestPseudoHeaders
          (Encoder *this,BitOStream *outputStream,HttpHeader *header)

{
  pointer pHVar1;
  qsizetype qVar2;
  bool bVar3;
  QDebug *pQVar4;
  bool bVar5;
  char *pcVar6;
  QByteArrayView *pQVar7;
  long lVar8;
  pointer field;
  long in_FS_OFFSET;
  bool headerFound [3];
  QByteArrayView headerName [3];
  QDebug local_98;
  QByteArrayView local_90;
  undefined4 uStack_80;
  undefined4 local_7c;
  char *local_78;
  char local_6c [4];
  QByteArrayView local_68;
  QByteArrayView local_58;
  QByteArrayView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.m_size = 10;
  local_68.m_data = ":authority";
  local_58.m_size = 7;
  local_58.m_data = ":scheme";
  local_48.m_size = 5;
  local_48.m_data = ":path";
  local_6c[2] = '\0';
  local_6c[0] = '\0';
  local_6c[1] = '\0';
  pHVar1 = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = false;
  for (field = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)
               ._M_impl.super__Vector_impl_data._M_start; field != pHVar1; field = field + 1) {
    local_90.m_size._0_4_ = 0x2487c9;
    local_90.m_size._4_4_ = 0;
    bVar3 = ::operator==(&field->name,(char **)&local_90);
    if (bVar3) {
      pcVar6 = "invalid pseudo-header (:status) in a request";
      goto LAB_001ca6ac;
    }
    local_90.m_size._0_4_ = 0x248837;
    local_90.m_size._4_4_ = 0;
    bVar3 = ::operator==(&field->name,(char **)&local_90);
    if (bVar3) {
      if (bVar5) {
        pcVar6 = "only one :method pseudo-header is allowed";
        goto LAB_001ca6ac;
      }
      encodeMethod(this,outputStream,field);
      bVar5 = true;
    }
    else {
      local_90.m_size._0_4_ = 0x241d69;
      local_90.m_size._4_4_ = 0;
      bVar3 = ::operator==(&field->name,(char **)&local_90);
      if (!bVar3) {
        pQVar7 = &local_68;
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          pcVar6 = (field->name).d.ptr;
          qVar2 = (field->name).d.size;
          local_90.m_size._0_4_ = (undefined4)qVar2;
          local_90.m_size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
          local_90.m_data._0_4_ = SUB84(pcVar6,0);
          local_90.m_data._4_4_ = (undefined4)((ulong)pcVar6 >> 0x20);
          bVar3 = comparesEqual(&local_90,pQVar7);
          if (bVar3) {
            if (local_6c[lVar8] == '\x01') {
              local_90.m_size._0_4_ = 2;
              local_7c = 0;
              local_90.m_size._4_4_ = 0;
              local_90.m_data._0_4_ = 0;
              local_90.m_data._4_4_ = 0;
              uStack_80 = 0;
              local_78 = "default";
              QMessageLogger::critical();
              pQVar4 = QDebug::operator<<(&local_98,"only one");
              pQVar4 = QDebug::operator<<(pQVar4,*pQVar7);
              pcVar6 = "pseudo-header is allowed";
              goto LAB_001ca619;
            }
            bVar3 = encodeHeaderField(this,outputStream,field);
            if (!bVar3) goto LAB_001ca629;
            local_6c[lVar8] = '\x01';
            break;
          }
          pQVar7 = pQVar7 + 1;
        }
      }
    }
  }
  if (bVar5) {
    pQVar7 = &local_58;
    if (local_6c[1] != '\0') {
      bVar5 = true;
      pQVar7 = &local_48;
      if (local_6c[2] == '\x01') goto LAB_001ca6b5;
    }
    local_90.m_size._0_4_ = 2;
    local_7c = 0;
    local_90.m_size._4_4_ = 0;
    local_90.m_data._0_4_ = 0;
    local_90.m_data._4_4_ = 0;
    uStack_80 = 0;
    local_78 = "default";
    QMessageLogger::critical();
    pQVar4 = QDebug::operator<<(&local_98,"mandatory");
    pQVar4 = QDebug::operator<<(pQVar4,*pQVar7);
    pcVar6 = "pseudo-header not found";
LAB_001ca619:
    QDebug::operator<<(pQVar4,pcVar6);
    QDebug::~QDebug(&local_98);
LAB_001ca629:
    bVar5 = false;
  }
  else {
    pcVar6 = "mandatory :method pseudo-header not found";
LAB_001ca6ac:
    local_78 = "default";
    local_7c = 0;
    uStack_80 = 0;
    local_90.m_data._4_4_ = 0;
    local_90.m_data._0_4_ = 0;
    local_90.m_size._4_4_ = 0;
    local_90.m_size._0_4_ = 2;
    bVar5 = false;
    QMessageLogger::critical((char *)&local_90,pcVar6);
  }
LAB_001ca6b5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool Encoder::encodeRequestPseudoHeaders(BitOStream &outputStream,
                                         const HttpHeader &header)
{
    // The following pseudo-header fields are defined for HTTP/2 requests:
    // - The :method pseudo-header field includes the HTTP method
    // - The :scheme pseudo-header field includes the scheme portion of the target URI
    // - The :authority pseudo-header field includes the authority portion of the target URI
    // - The :path pseudo-header field includes the path and query parts of the target URI

    // All HTTP/2 requests MUST include exactly one valid value for the :method,
    // :scheme, and :path pseudo-header fields, unless it is a CONNECT request
    // (Section 8.3). An HTTP request that omits mandatory pseudo-header fields
    // is malformed (Section 8.1.2.6).

    using size_type = decltype(header.size());

    bool methodFound = false;
    constexpr QByteArrayView headerName[] = {":authority", ":scheme", ":path"};
    constexpr size_type nHeaders = std::size(headerName);
    bool headerFound[nHeaders] = {};

    for (const auto &field : header) {
        if (field.name == ":status") {
            qCritical("invalid pseudo-header (:status) in a request");
            return false;
        }

        if (field.name == ":method") {
            if (methodFound) {
                qCritical("only one :method pseudo-header is allowed");
                return false;
            }

            if (!encodeMethod(outputStream, field))
                return false;
            methodFound = true;
        } else if (field.name == "cookie") {
            // "crumbs" ...
        } else {
            for (size_type j = 0; j < nHeaders; ++j) {
                if (field.name == headerName[j]) {
                    if (headerFound[j]) {
                        qCritical() << "only one" << headerName[j] << "pseudo-header is allowed";
                        return false;
                    }
                    if (!encodeHeaderField(outputStream, field))
                        return false;
                    headerFound[j] = true;
                    break;
                }
            }
        }
    }

    if (!methodFound) {
        qCritical("mandatory :method pseudo-header not found");
        return false;
    }

    // 1: don't demand headerFound[0], as :authority isn't mandatory.
    for (size_type i = 1; i < nHeaders; ++i) {
        if (!headerFound[i]) {
            qCritical() << "mandatory" << headerName[i]
                        << "pseudo-header not found";
            return false;
        }
    }

    return true;
}